

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
inja::Parser::Parser
          (Parser *this,ParserConfig *parser_config,LexerConfig *lexer_config,
          TemplateStorage *template_storage,FunctionStorage *function_storage)

{
  this->config = parser_config;
  (this->lexer).config = lexer_config;
  (this->lexer).state = Text;
  (this->lexer).minus_state = Number;
  (this->lexer).m_in._M_len = 0;
  (this->lexer).m_in._M_str = (char *)0x0;
  (this->lexer).tok_start = 0;
  (this->lexer).pos = 0;
  this->template_storage = template_storage;
  this->function_storage = function_storage;
  (this->tok).kind = Unknown;
  (this->tok).text._M_len = 0;
  (this->tok).text._M_str = (char *)0x0;
  (this->peek_tok).kind = Unknown;
  (this->peek_tok).text._M_len = 0;
  (this->peek_tok).text._M_str = (char *)0x0;
  this->have_peek_tok = false;
  (this->literal_start)._M_len = 0;
  (this->literal_start)._M_str = (char *)0x0;
  this->current_block = (BlockNode *)0x0;
  this->current_expression_list = (ExpressionListNode *)0x0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->if_statement_stack).c.
  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>::
  _M_initialize_map((_Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                     *)&this->if_statement_stack,0);
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->for_statement_stack).c.
  super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>::
  _M_initialize_map((_Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                     *)&this->for_statement_stack,0);
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->block_statement_stack).c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>::
  _M_initialize_map((_Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                     *)&this->block_statement_stack,0);
  return;
}

Assistant:

explicit Parser(const ParserConfig& parser_config, const LexerConfig& lexer_config, TemplateStorage& template_storage,
                  const FunctionStorage& function_storage)
      : config(parser_config), lexer(lexer_config), template_storage(template_storage), function_storage(function_storage) {}